

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O2

NpyArray *
load_the_npz_array(NpyArray *__return_storage_ptr__,FILE *fp,uint32_t compr_bytes,
                  uint32_t uncompr_bytes)

{
  element_type *peVar1;
  void *__dest;
  size_t sVar2;
  runtime_error *this;
  ulong __n;
  bool fortran_order;
  size_t word_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_uncompr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_compr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  pointer local_a0;
  uint32_t local_98;
  pointer local_88;
  uint32_t local_80;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  
  __n = (ulong)compr_bytes;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buffer_compr,__n,(allocator_type *)&local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buffer_uncompr,(ulong)uncompr_bytes,(allocator_type *)&local_a0);
  sVar2 = fread(buffer_compr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start,1,__n,(FILE *)fp);
  if (sVar2 == __n) {
    local_98 = 0;
    local_a0 = (pointer)0x0;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    inflateInit2_(&local_a0,0xfffffffffffffff1,"1.2.11",0x70);
    local_a0 = buffer_compr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_88 = buffer_uncompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_98 = compr_bytes;
    local_80 = uncompr_bytes;
    inflate(&local_a0,4);
    inflateEnd(&local_a0);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cnpy::parse_npy_header
              (buffer_uncompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,&word_size,&shape,&fortran_order);
    cnpy::NpyArray::NpyArray(__return_storage_ptr__,&shape,word_size,fortran_order);
    peVar1 = (__return_storage_ptr__->data_holder).
             super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    __dest = (peVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = (long)(peVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__dest;
    memcpy(__dest,buffer_uncompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + (uncompr_bytes - sVar2),sVar2);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer_uncompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer_compr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"load_the_npy_file: failed fread");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

cnpy::NpyArray load_the_npz_array(FILE* fp, uint32_t compr_bytes, uint32_t uncompr_bytes) {

    std::vector<unsigned char> buffer_compr(compr_bytes);
    std::vector<unsigned char> buffer_uncompr(uncompr_bytes);
    size_t nread = fread(&buffer_compr[0],1,compr_bytes,fp);
    if(nread != compr_bytes)
        throw std::runtime_error("load_the_npy_file: failed fread");

    int err;
    z_stream d_stream;

    d_stream.zalloc = Z_NULL;
    d_stream.zfree = Z_NULL;
    d_stream.opaque = Z_NULL;
    d_stream.avail_in = 0;
    d_stream.next_in = Z_NULL;
    err = inflateInit2(&d_stream, -MAX_WBITS);

    d_stream.avail_in = compr_bytes;
    d_stream.next_in = &buffer_compr[0];
    d_stream.avail_out = uncompr_bytes;
    d_stream.next_out = &buffer_uncompr[0];

    err = inflate(&d_stream, Z_FINISH);
    err = inflateEnd(&d_stream);

    std::vector<size_t> shape;
    size_t word_size;
    bool fortran_order;
    cnpy::parse_npy_header(&buffer_uncompr[0],word_size,shape,fortran_order);

    cnpy::NpyArray array(shape, word_size, fortran_order);

    size_t offset = uncompr_bytes - array.num_bytes();
    memcpy(array.data<unsigned char>(),&buffer_uncompr[0]+offset,array.num_bytes());

    return array;
}